

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall
GdlRuleTable::CheckTablesAndPasses
          (GdlRuleTable *this,GrcManager *pcman,int *pnPassNum,int *pipassBidi)

{
  bool bVar1;
  _Rb_tree_color _Var2;
  size_type_conflict sVar3;
  ulong uVar4;
  GdlRenderer *this_00;
  reference ppGVar5;
  int *in_RDX;
  GrcManager *in_RSI;
  string *in_RDI;
  int fsdcScriptDir;
  int fsdcPassDir;
  string staPass;
  uint ipass;
  GdlPass *in_stack_fffffffffffffce0;
  allocator *in_stack_fffffffffffffd08;
  allocator *in_stack_fffffffffffffd10;
  allocator *in_stack_fffffffffffffd18;
  allocator *in_stack_fffffffffffffd20;
  GrcSymbolTableEntry *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  _Rb_tree_color in_stack_fffffffffffffd34;
  GdlRenderer *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd44;
  allocator *in_stack_fffffffffffffd50;
  allocator local_299;
  undefined1 local_298 [71];
  allocator local_251;
  string local_250 [32];
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [39];
  undefined1 local_c1 [33];
  _Rb_tree_color local_a0;
  _Rb_tree_color local_9c;
  string local_98 [32];
  uint local_78;
  allocator local_61;
  string local_60 [32];
  string local_40 [40];
  int *local_18;
  GrcManager *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::size
                    ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38));
  if (1 < sVar3) {
    std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
              ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),0);
    bVar1 = GdlPass::HasRules((GdlPass *)0x15bdd7);
    if (bVar1) {
      GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd50 = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60," table is multi-pass, so all rules must be explicitly placed in a pass",
                 in_stack_fffffffffffffd50);
      GrcErrorList::AddError
                ((GrcErrorList *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                 (GdlObject *)in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                 (string *)in_stack_fffffffffffffd10);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::__cxx11::string::~string(local_40);
    }
  }
  for (local_78 = 0; uVar4 = (ulong)local_78,
      sVar3 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::size
                        ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38)),
      uVar4 < sVar3; local_78 = local_78 + 1) {
    std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
              ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),(ulong)local_78);
    bVar1 = GdlPass::ValidPass(in_stack_fffffffffffffce0);
    in_stack_fffffffffffffd44 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd44);
    if (bVar1) {
      ppGVar5 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                          ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),
                           (ulong)local_78);
      GdlPass::AssignGlobalID(*ppGVar5,*local_18);
      *local_18 = *local_18 + 1;
      ppGVar5 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                          ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),
                           (ulong)local_78);
      _Var2 = GdlPass::Direction(*ppGVar5);
      local_9c = _Var2;
      in_stack_fffffffffffffd38 = GrcManager::Renderer(local_10);
      in_stack_fffffffffffffd34 = GdlRenderer::ScriptDirections(in_stack_fffffffffffffd38);
      local_a0 = in_stack_fffffffffffffd34;
      if (((local_9c == _S_red) || (local_9c == _S_black)) || (local_9c == 2)) {
        if (((local_9c == _S_red) || (in_stack_fffffffffffffd34 == _S_black)) ||
           (in_stack_fffffffffffffd34 == 2)) {
          if ((local_9c == _S_red) || (in_stack_fffffffffffffd34 != local_9c)) {
            if (0 < (int)local_9c) {
              ppGVar5 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                                  ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),
                                   (ulong)local_78);
              GdlPass::SetFlipDirection(*ppGVar5,true);
              this_00 = GrcManager::Renderer(local_10);
              GdlRenderer::SetHasFlippedPass(this_00,true);
            }
          }
          else {
            in_stack_fffffffffffffd10 = &local_199;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,"Direction of pass ",in_stack_fffffffffffffd10);
            std::__cxx11::string::string(local_1c0,local_98);
            in_stack_fffffffffffffd08 = &local_1e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1e0," matches font\'s ScriptDirection and will have no effect ",
                       in_stack_fffffffffffffd08);
            GrcErrorList::AddWarning
                      ((GrcErrorList *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                       ,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                       (GdlObject *)in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                       (string *)in_stack_fffffffffffffd10,(string *)in_stack_fffffffffffffd08);
            std::__cxx11::string::~string(local_1e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            std::__cxx11::string::~string(local_1c0);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
          }
        }
        else {
          in_stack_fffffffffffffd20 = &local_109;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_108,"Direction directive invalid (on pass ",in_stack_fffffffffffffd20);
          std::__cxx11::string::string(local_130,local_98);
          in_stack_fffffffffffffd18 = &local_151;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_150,") due to font ScriptDirection setting of ",in_stack_fffffffffffffd18
                    );
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
          GrcErrorList::AddError
                    ((GrcErrorList *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                     (GdlObject *)in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                     (string *)in_stack_fffffffffffffd10,(string *)in_stack_fffffffffffffd08,
                     (string *)CONCAT44(in_stack_fffffffffffffd44,_Var2));
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string(local_150);
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
          std::__cxx11::string::~string(local_130);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
        }
      }
      else {
        in_stack_fffffffffffffd28 = (GrcSymbolTableEntry *)local_c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c1 + 1),"Invalid direction for pass ",
                   (allocator *)in_stack_fffffffffffffd28);
        std::__cxx11::string::string(local_e8,local_98);
        GrcErrorList::AddError
                  ((GrcErrorList *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                   (GdlObject *)in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18,
                   (string *)in_stack_fffffffffffffd10);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string((string *)(local_c1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c1);
      }
    }
    else if (local_78 == 0) {
      ppGVar5 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                          ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),0);
      GdlPass::AssignGlobalID(*ppGVar5,-1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"Pass ",&local_209);
      std::__cxx11::string::string(local_230,local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250," of ",&local_251);
      GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffd28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_298," table contains no rules",&local_299);
      in_stack_fffffffffffffce0 = (GdlPass *)local_298;
      GrcErrorList::AddWarning
                ((GrcErrorList *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                 (GdlObject *)in_stack_fffffffffffffd28,(string *)in_stack_fffffffffffffd20,
                 (string *)in_stack_fffffffffffffd18,(string *)in_stack_fffffffffffffd10,
                 (string *)in_stack_fffffffffffffd50,in_RDI);
      std::__cxx11::string::~string((string *)local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      std::__cxx11::string::~string((string *)(local_298 + 0x20));
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      ppGVar5 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
                          ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)(in_RDI + 0x38),
                           (ulong)local_78);
      GdlPass::AssignGlobalID(*ppGVar5,-1);
    }
    std::__cxx11::string::~string(local_98);
  }
  return;
}

Assistant:

void GdlRuleTable::CheckTablesAndPasses(GrcManager * pcman, int *pnPassNum, int *pipassBidi)
{
	if (m_vppass.size() > 1 && m_vppass[0]->HasRules())
	{
		g_errorList.AddError(3102, this,
			m_psymName->FullName(),
			" table is multi-pass, so all rules must be explicitly placed in a pass");

		// but go ahead and treat it as the zeroth pass for now
	}

	for (auto ipass = 0U; ipass < m_vppass.size(); ++ipass)
	{
		auto const staPass = std::to_string(ipass);
		if (m_vppass[ipass]->ValidPass())
		{
			m_vppass[ipass]->AssignGlobalID(*pnPassNum);
			(*pnPassNum)++;

			int fsdcPassDir = m_vppass[ipass]->Direction();
			int fsdcScriptDir = pcman->Renderer()->ScriptDirections();
			if (fsdcPassDir != kfsdcNone && fsdcPassDir != kfsdcHorizLtr && fsdcPassDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3166, this,
					"Invalid direction for pass ",
					staPass);
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir != kfsdcHorizLtr && fsdcScriptDir != kfsdcHorizRtl)
			{
				g_errorList.AddError(3167, this,
					"Direction directive invalid (on pass ",
					staPass,
					") due to font ScriptDirection setting of ",
					std::to_string(fsdcScriptDir));
			}
			else if (fsdcPassDir != kfsdcNone && fsdcScriptDir == fsdcPassDir)
			{
				g_errorList.AddWarning(3539, this,
					"Direction of pass ",
					staPass,
					" matches font's ScriptDirection and will have no effect ");
			}
			else
			{
				Assert(fsdcScriptDir >= kfsdcNone);
				Assert(fsdcScriptDir <= kfsdcHorizRtl);
				if (fsdcPassDir > kfsdcNone)
				{
					Assert(fsdcScriptDir != fsdcPassDir);
					m_vppass[ipass]->SetFlipDirection(true);
					pcman->Renderer()->SetHasFlippedPass(true);
				}
			}
		}
		else if (ipass == 0)
		{
			// okay--zeroth pass *should* be empty if there are other passes
			m_vppass[ipass]->AssignGlobalID(-1);
		}
		else
		{
			g_errorList.AddWarning(3503, this,
				"Pass ",
				staPass,
				" of ",
				m_psymName->FullName(),
				" table contains no rules");
			m_vppass[ipass]->AssignGlobalID(-1);
		}
	}
}